

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.h
# Opt level: O0

void __thiscall iqxmlrpc::http::Packet::Packet(Packet *this,Packet *param_1)

{
  Packet *param_1_local;
  Packet *this_local;
  
  this->_vptr_Packet = (_func_int **)&PTR__Packet_002528f8;
  boost::shared_ptr<iqxmlrpc::http::Header>::shared_ptr(&this->header_,&param_1->header_);
  std::__cxx11::string::string((string *)&this->content_,(string *)&param_1->content_);
  return;
}

Assistant:

class LIBIQXMLRPC_API Packet {
protected:
  boost::shared_ptr<http::Header> header_;
  std::string content_;

public:
  Packet( http::Header* header, const std::string& content );
  virtual ~Packet();

  //! Sets header option "connection: {keep-alive|close}".
  //! By default connection is close.
  void set_keep_alive( bool = true );

  const http::Header* header()  const { return header_.get(); }
  const std::string&  content() const { return content_; }

  std::string dump() const
  {
    return header_->dump() + content_;
  }
}